

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

void __thiscall LinkedReadsDatastore::load_index(LinkedReadsDatastore *this,string *_filename)

{
  char *pcVar1;
  FILE *pFVar2;
  ostream *poVar3;
  int *piVar4;
  runtime_error *prVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  void *pvVar6;
  uint *__ptr;
  size_type __n;
  size_type sVar7;
  size_t sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint64_t sname;
  SDG_FILETYPE type;
  sdgVersion_t version;
  sdgMagic_t magic;
  uint64_t s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  size_type in_stack_fffffffffffffe48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  size_t __n_00;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int __val;
  string local_140 [39];
  undefined1 local_119;
  string local_98 [39];
  undefined1 local_71;
  string local_70 [36];
  short local_4c;
  ushort local_4a;
  short local_48;
  undefined1 local_45;
  string local_38 [32];
  undefined1 local_18 [24];
  
  std::__cxx11::string::operator=((string *)in_RDI,(string *)in_RSI);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pFVar2 = fopen(pcVar1,"r");
  in_RDI[9]._M_string_length = (size_type)pFVar2;
  if (in_RDI[9]._M_string_length == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
    poVar3 = std::operator<<(poVar3,(string *)in_RDI);
    poVar3 = std::operator<<(poVar3,": ");
    piVar4 = __errno_location();
    pcVar1 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar1);
    local_45 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   in_stack_fffffffffffffe70);
    std::runtime_error::runtime_error(prVar5,local_38);
    local_45 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fread(&local_48,2,1,(FILE *)in_RDI[9]._M_string_length);
  fread(&local_4a,2,1,(FILE *)in_RDI[9]._M_string_length);
  fread(&local_4c,2,1,(FILE *)in_RDI[9]._M_string_length);
  if (local_48 != 0x5d6) {
    local_71 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   in_stack_fffffffffffffe70);
    std::runtime_error::runtime_error(prVar5,local_70);
    local_71 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4a < 3) {
    local_119 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_fffffffffffffe7c);
    std::operator+((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
    std::__cxx11::to_string(in_stack_fffffffffffffe7c);
    std::operator+(in_RDI,in_RSI);
    std::runtime_error::runtime_error(prVar5,local_98);
    local_119 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_4c != 3) {
    __val = CONCAT13(1,(int3)in_stack_fffffffffffffe7c);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    std::__cxx11::to_string(__val);
    std::operator+((char *)__lhs,in_stack_fffffffffffffe30);
    std::operator+(__lhs,(char *)in_stack_fffffffffffffe30);
    std::runtime_error::runtime_error((runtime_error *)__lhs,local_140);
    __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __n_00 = 0;
  fread(&stack0xfffffffffffffe70,8,1,(FILE *)in_RDI[9]._M_string_length);
  std::__cxx11::string::resize((ulong)&in_RDI[6].field_2);
  pvVar6 = (void *)std::__cxx11::string::data();
  fread(pvVar6,1,__n_00,(FILE *)in_RDI[9]._M_string_length);
  fread(in_RDI + 1,8,1,(FILE *)in_RDI[9]._M_string_length);
  fread(local_18,8,1,(FILE *)in_RDI[9]._M_string_length);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  __ptr = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3c2310);
  __n = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&in_RDI[8].field_2);
  fread(__ptr,4,__n,(FILE *)in_RDI[9]._M_string_length);
  sVar7 = ftell((FILE *)in_RDI[9]._M_string_length);
  in_RDI[1]._M_string_length = sVar7;
  poVar3 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffe58 >> 0x18,0));
  poVar3 = std::operator<<(poVar3,"LinkedReadsDatastore open: ");
  poVar3 = std::operator<<(poVar3,(string *)in_RSI);
  poVar3 = std::operator<<(poVar3,"  max read length: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(ulong *)(in_RDI + 1));
  poVar3 = std::operator<<(poVar3," Total reads: ");
  sVar8 = size((LinkedReadsDatastore *)0x3c23c5);
  pvVar6 = (void *)std::ostream::operator<<(poVar3,sVar8);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void LinkedReadsDatastore::load_index(std::string _filename){
    uint64_t s;
    filename=_filename;
    fd=fopen(filename.c_str(),"r");
    if (!fd) {
        std::cerr << "Failed to open " << filename <<": " << strerror(errno);
        throw std::runtime_error("Could not open " + filename);
    }
    sdgMagic_t magic;
    sdgVersion_t version;
    SDG_FILETYPE type;
    fread((char *) &magic, sizeof(magic),1,fd);
    fread((char *) &version, sizeof(version),1,fd);
    fread((char *) &type, sizeof(type),1,fd);

    if (magic != SDG_MAGIC) {
        throw std::runtime_error("Magic number not present in " + _filename);
    }

    if (version < min_compat) {
        throw std::runtime_error("LinkedReadsDS file version: " + std::to_string(version) + " is not compatible with " + std::to_string(min_compat));
    }

    if (type != LinkedDS_FT) {
        throw std::runtime_error("File type supplied: " + std::to_string(type) + " is not compatible with LinkedDS_FT");
    }

    uint64_t sname=0;
    fread( &sname, sizeof(sname), 1, fd);
    name.resize(sname);
    fread( (char *) name.data(), sizeof(char), sname, fd);

    fread( &readsize,sizeof(readsize),1,fd);
    fread(&s,sizeof(s),1,fd); read_tag.resize(s);
    fread(read_tag.data(),sizeof(read_tag[0]),read_tag.size(),fd);
    readpos_offset=ftell(fd);
    sdglib::OutputLog()<<"LinkedReadsDatastore open: "<<_filename<<"  max read length: "<<readsize<<" Total reads: " <<size()<<std::endl;
}